

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

bool anon_unknown.dwarf_44::SolverDpllTriadSimd<1>::BoxRestrict<0>
               (State *state,int box_idx,Cells16 *candidates)

{
  Cells08 *pCVar1;
  longlong *plVar2;
  int band_idx;
  int from_peer;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  bool bVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 in_ZMM0 [64];
  
  auVar9 = (anonymous_namespace)::tables._6080_32_;
  auVar8 = (anonymous_namespace)::tables._6048_32_;
  auVar7 = (anonymous_namespace)::tables._6016_32_;
  auVar6 = _DAT_001085a0;
  lVar11 = (long)box_idx;
  bVar10 = true;
  auVar20 = *(undefined1 (*) [32])state->boxen[lVar11].cells.vec;
  if ((auVar20 & ~in_ZMM0._0_32_) != (undefined1  [32])0x0) {
    auVar4 = vpmovsxbw_avx2(_DAT_00108010);
    auVar19 = vpandn_avx2(in_ZMM0._0_32_,auVar20);
    band_idx = *(int *)((anonymous_namespace)::tables + lVar11 * 4 + 0x18dc);
    from_peer = *(int *)((anonymous_namespace)::tables + lVar11 * 4 + 0x18b8);
    pCVar1 = &state->bands[0][from_peer].eliminations;
    plVar2 = state->boxen[(long)band_idx + -3].cells.vec + 2;
    lVar12 = (long)(band_idx * 3 + from_peer) * 0x20;
    do {
      auVar20 = vpandn_avx2(auVar19,auVar20);
      auVar13 = vpopcntw_avx512_bitalg(auVar20);
      *(undefined1 (*) [32])state->boxen[lVar11].cells.vec = auVar20;
      uVar5 = vpcmpw_avx512vl(auVar13,auVar4,1);
      if ((short)uVar5 != 0) goto LAB_00105b78;
      auVar14 = vprolq_avx512vl(auVar20,0x10);
      auVar15 = vprolq_avx512vl(auVar20,0x20);
      auVar13 = vpcmpeqw_avx2(auVar13,auVar4);
      auVar13 = vpand_avx2(auVar13,auVar20);
      auVar17 = vpand_avx2(auVar14,auVar20);
      auVar14 = vpor_avx2(auVar14,auVar20);
      auVar16 = vpternlogd_avx512vl(auVar17,auVar15,auVar14,0xf8);
      auVar17 = vpor_avx2(auVar15,auVar14);
      auVar14 = vprolq_avx512vl(auVar20,0x30);
      auVar17 = vpternlogd_avx512vl(auVar14,auVar17,auVar16,0xea);
      auVar14 = vpermq_avx2(auVar20,0x4e);
      auVar15 = vpternlogd_avx512vl(auVar17,auVar20,auVar13,0xae);
      auVar17 = vpermq_avx2(auVar20,0x39);
      auVar13 = vpand_avx2(auVar17,auVar20);
      auVar17 = vpor_avx2(auVar17,auVar20);
      auVar16 = vpternlogd_avx512vl(auVar13,auVar14,auVar17,0xf8);
      auVar13 = vpor_avx2(auVar14,auVar17);
      auVar17 = vpermq_avx2(auVar20,0x93);
      auVar13 = vpternlogd_avx512vl(auVar17,auVar13,auVar16,0xea);
      auVar18 = vpternlogd_avx512vl(auVar13,auVar20,auVar15,0xae);
      auVar20 = vpand_avx2(auVar18,auVar7);
      auVar13 = vpermq_avx2(auVar20,0x39);
      auVar17 = vprolq_avx512vl(auVar20,0x10);
      auVar13 = vpor_avx2(auVar13,auVar20);
      auVar14 = vpermq_avx2(auVar13,0x4e);
      auVar17 = vpor_avx2(auVar17,auVar20);
      auVar13 = vpor_avx2(auVar14,auVar13);
      auVar16 = vpshufd_avx2(auVar17,0xb1);
      auVar14 = vpshufb_avx2(auVar13,auVar8);
      auVar15 = vpshufb_avx2(auVar13,auVar9);
      auVar17 = vpor_avx2(auVar16,auVar17);
      auVar14 = vpternlogd_avx512vl(auVar15,auVar13,auVar14,0xfe);
      auVar13 = vpcmpgtw_avx2(auVar20,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar17 = vpternlogd_avx512vl(auVar17,auVar14,auVar13,0xfe);
      auVar19 = vpternlogd_avx512vl(auVar19,auVar17,auVar20,0xf6);
      auVar20 = vpshufb_avx2(auVar18,auVar6);
      auVar3 = vpor_avx(auVar20._16_16_,auVar20._0_16_);
      auVar13._0_16_ = ZEXT116(0) * auVar18._16_16_ + ZEXT116(1) * auVar3;
      auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18._16_16_
      ;
      auVar20 = vpshufb_avx2(auVar17,auVar6);
      auVar13 = vpshufb_avx2(auVar13,*(undefined1 (*) [32])
                                      ((anonymous_namespace)::tables + lVar12 + 0x1360));
      auVar3 = vpor_avx(auVar20._16_16_,auVar20._0_16_);
      auVar14._0_16_ = ZEXT116(0) * auVar17._16_16_ + ZEXT116(1) * auVar3;
      auVar14._16_16_ = ZEXT116(1) * auVar17._16_16_;
      auVar20 = vpshufb_avx2(auVar14,*(undefined1 (*) [32])
                                      ((anonymous_namespace)::tables + lVar12 + 0x1480));
      auVar17 = vpshufb_avx2(auVar14,*(undefined1 (*) [32])
                                      ((anonymous_namespace)::tables + lVar12 + 0x15a0));
      auVar20 = vpternlogd_avx512vl(auVar17,auVar13,auVar20,0xfe);
      auVar3 = vpor_avx(auVar20._0_16_,*(undefined1 (*) [16])pCVar1->vec);
      *(undefined1 (*) [16])pCVar1->vec = auVar3;
      auVar3 = vpor_avx(auVar20._16_16_,*(undefined1 (*) [16])plVar2);
      *(undefined1 (*) [16])plVar2 = auVar3;
      auVar20 = *(undefined1 (*) [32])state->boxen[lVar11].cells.vec;
    } while ((auVar20 & auVar19) != (undefined1  [32])0x0);
    bVar10 = BandEliminate<1>(state,band_idx,from_peer);
    if (bVar10) {
      bVar10 = BandEliminate<0>(state,from_peer,band_idx);
      return bVar10;
    }
LAB_00105b78:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

static bool BoxRestrict(State &state, int box_idx, const Cells16 &candidates) {
        // return immediately if there are no new eliminations
        Box &box = state.boxen[box_idx];
        if (box.cells.SubsetOf(candidates)) return true;
        auto eliminating = box.cells.and_not(candidates);

        int box_i = tables.div3[box_idx];
        int box_j = tables.mod3[box_idx];

        Band &h_band = state.bands[0][box_i];
        Band &v_band = state.bands[1][box_j];
        do {
            // apply eliminations and check that no cell clause now violates its minimum
            box.cells = box.cells.and_not(eliminating);
            Cells16 counts = box.cells.Popcounts9();
            const Cells16 box_minimums{1, 1, 1, 6, 1, 1, 1, 6, 1, 1, 1, 6, 6, 6, 6, 0};
            if (counts.AnyLessThan(box_minimums)) return false;

            // gather literals asserted by triggered cell clauses
            Cells16 triggered = counts.WhichEqual(box_minimums);
            Cells16 all_assertions = box.cells & triggered;
            // and add literals asserted by triggered triad definition clauses
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateRows(); }, all_assertions);
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateCols(); }, all_assertions);

            // construct elimination messages for this box and for our band peers
            AssertionsToEliminations(all_assertions, box_i, box_j, eliminating,
                                     h_band.eliminations, v_band.eliminations);

        } while (eliminating.Intersects(box.cells));

        // send elimination messages to horizontal and vertical peers. Prefer to send the first
        // of these messages to the peer whose orientation is opposite that of the inbound peer.
        if (from_vertical) {
            return BandEliminate<0>(state, box_i, box_j) &&
                   BandEliminate<1>(state, box_j, box_i);
        } else {
            return BandEliminate<1>(state, box_j, box_i) &&
                   BandEliminate<0>(state, box_i, box_j);
        }
    }